

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O2

bool ADSBExchangeConnection::TestADSBExAPIKeyResult(bool *bIsKeyValid)

{
  bool bVar1;
  future_status fVar2;
  duration<long,_std::ratio<1L,_1000000L>_> local_18;
  
  local_18.__r = 0;
  fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1000000l>>
                    (&futADSBExKeyValid.super___basic_future<bool>,&local_18);
  if (fVar2 == ready) {
    bVar1 = std::future<bool>::get(&futADSBExKeyValid);
    *bIsKeyValid = bVar1;
  }
  return fVar2 == ready;
}

Assistant:

bool ADSBExchangeConnection::TestADSBExAPIKeyResult (bool& bIsKeyValid)
{
    // did the check not yet come back?
    if (std::future_status::ready != futADSBExKeyValid.wait_for(std::chrono::microseconds(0)))
        return false;
    
    // is done, return the result
    bIsKeyValid = futADSBExKeyValid.get();
    return true;
}